

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_report_handler.cpp
# Opt level: O0

sc_actions sc_core::sc_report_handler::execute(sc_msg_def *md,sc_severity severity_)

{
  uint *call_count;
  uint *limit;
  sc_actions actions;
  sc_severity severity__local;
  sc_msg_def *md_local;
  
  actions = md->sev_actions[severity_];
  if (actions == 0) {
    actions = md->actions;
  }
  if (actions == 0) {
    actions = (&sev_actions)[severity_];
  }
  actions = force_mask | (suppress_mask ^ 0xffffffff) & actions;
  limit = (uint *)0x0;
  call_count = (uint *)0x0;
  if (md->sev_call_count[severity_] != 0xffffffff) {
    md->sev_call_count[severity_] = md->sev_call_count[severity_] + 1;
  }
  if (md->call_count != 0xffffffff) {
    md->call_count = md->call_count + 1;
  }
  if ((&sev_call_count)[severity_] != -1) {
    (&sev_call_count)[severity_] = (&sev_call_count)[severity_] + 1;
  }
  if ((md->limit_mask & 1 << ((char)severity_ + 1U & 0x1f)) != 0) {
    limit = md->sev_limit + (int)severity_;
    call_count = md->sev_call_count + (int)severity_;
  }
  if ((limit == (uint *)0x0) && ((md->limit_mask & 1) != 0)) {
    limit = &md->limit;
    call_count = &md->call_count;
  }
  if (limit == (uint *)0x0) {
    limit = (uint *)(sev_limit + (long)(int)severity_ * 4);
    call_count = &sev_call_count + (int)severity_;
  }
  if (((*limit != 0) && (*limit != 0xffffffff)) && (*limit <= *call_count)) {
    actions = actions | 0x40;
  }
  return actions;
}

Assistant:

sc_actions sc_report_handler::execute(sc_msg_def* md, sc_severity severity_)
{
    sc_actions actions = md->sev_actions[severity_]; // high prio

    if ( SC_UNSPECIFIED == actions ) // middle prio
	actions = md->actions;

    if ( SC_UNSPECIFIED == actions ) // the lowest prio
	actions = sev_actions[severity_];

    actions &= ~suppress_mask; // higher than the high prio
    actions |= force_mask; // higher than above, and the limit is the highest

    unsigned * limit = 0;
    unsigned * call_count = 0;

    // just increment counters and check for overflow
    if ( md->sev_call_count[severity_] < UINT_MAX )
	md->sev_call_count[severity_]++;
    if ( md->call_count < UINT_MAX )
	md->call_count++;
    if ( sev_call_count[severity_] < UINT_MAX )
	sev_call_count[severity_]++;

    if ( md->limit_mask & (1 << (severity_ + 1)) )
    {
	limit = md->sev_limit + severity_;
	call_count = md->sev_call_count + severity_;
    }
    if ( !limit && (md->limit_mask & 1) )
    {
	limit = &md->limit;
	call_count = &md->call_count;
    }
    if ( !limit )
    {
	limit = sev_limit + severity_;
	call_count = sev_call_count + severity_;
    }
    if ( *limit == 0 )
    {
	// stop limit disabled
    }
    else if ( *limit != UINT_MAX )
    {
	if ( *call_count >= *limit )
	    actions |= SC_STOP; // force sc_stop()
    }
    return actions;
}